

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int putVarint64(uchar *p,u64 v)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  u8 buf [10];
  uchar auStack_14 [2];
  byte local_12 [10];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (v >> 0x38 == 0) {
    lVar2 = 0;
    do {
      lVar3 = lVar2;
      auStack_14[lVar3 + 2] = (byte)v | 0x80;
      lVar2 = lVar3 + 1;
      bVar1 = 0x7f < v;
      v = v >> 7;
    } while (bVar1);
    local_12[0] = local_12[0] & 0x7f;
    lVar3 = lVar3 + 2;
    lVar4 = lVar2;
    do {
      *p = auStack_14[lVar3];
      p = p + 1;
      lVar3 = lVar3 + -1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  else {
    p[8] = (uchar)v;
    uVar5 = v >> 8;
    lVar2 = 8;
    do {
      p[lVar2 + -1] = (byte)uVar5 | 0x80;
      uVar5 = uVar5 >> 7;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
    lVar2 = 9;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)lVar2;
}

Assistant:

static int SQLITE_NOINLINE putVarint64(unsigned char *p, u64 v){
  int i, j, n;
  u8 buf[10];
  if( v & (((u64)0xff000000)<<32) ){
    p[8] = (u8)v;
    v >>= 8;
    for(i=7; i>=0; i--){
      p[i] = (u8)((v & 0x7f) | 0x80);
      v >>= 7;
    }
    return 9;
  }
  n = 0;
  do{
    buf[n++] = (u8)((v & 0x7f) | 0x80);
    v >>= 7;
  }while( v!=0 );
  buf[0] &= 0x7f;
  assert( n<=9 );
  for(i=0, j=n-1; j>=0; j--, i++){
    p[i] = buf[j];
  }
  return n;
}